

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.hpp
# Opt level: O1

bool isBuildInType(Token *token)

{
  TokenType TVar1;
  iterator iVar2;
  
  TVar1 = token->type;
  if (TVar1 == Name) {
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&BuiltInTypes_abi_cxx11_._M_t,&token->source);
    if ((_Rb_tree_header *)iVar2._M_node ==
        &BuiltInTypes_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::find(&BuiltInClasses_abi_cxx11_._M_t,&token->source);
    }
  }
  return TVar1 == Name;
}

Assistant:

bool isBuildInType(Token token) {
	if (token.type != Name) return false;
	if (BuiltInTypes.find(token.source) != BuiltInTypes.end() or
	    BuiltInClasses.find(token.source) != BuiltInClasses.end()) {
		return true;
	}
}